

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

Side __thiscall Application::convert(Application *this,Side *side)

{
  char cVar1;
  logic_error *this_00;
  Side *side_local;
  Application *this_local;
  
  cVar1 = FIX::CharField::operator_cast_to_char(&side->super_CharField);
  if (cVar1 == '1') {
    this_local._4_4_ = buy;
  }
  else {
    if (cVar1 != '2') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Unsupported Side, use buy or sell");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_local._4_4_ = sell;
  }
  return this_local._4_4_;
}

Assistant:

Order::Side Application::convert(const FIX::Side &side) {
  switch (side) {
  case FIX::Side_BUY:
    return Order::buy;
  case FIX::Side_SELL:
    return Order::sell;
  default:
    throw std::logic_error("Unsupported Side, use buy or sell");
  }
}